

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InstructionFolder::FoldBinaryIntegerOpToConstant
          (InstructionFolder *this,Instruction *inst,function<unsigned_int_(unsigned_int)> *id_map,
          uint32_t *result)

{
  IRContext *this_00;
  ConstantManager *pCVar1;
  uint **ppuVar2;
  undefined1 uVar3;
  bool bVar4;
  uint32_t uVar5;
  int iVar6;
  uint32_t uVar7;
  int32_t iVar8;
  Operand *pOVar9;
  uint **ppuVar10;
  const_iterator cVar11;
  ScalarConstant *pSVar12;
  ScalarConstant **ppSVar13;
  uint uVar14;
  ScalarConstant **ppSVar15;
  bool bVar16;
  bool bVar17;
  ScalarConstant *local_60;
  ScalarConstant *local_58 [2];
  uint local_44;
  uint32_t *local_40;
  ulong local_38;
  
  local_38 = (ulong)inst->opcode_;
  this_00 = this->context_;
  local_40 = result;
  if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(this_00);
  }
  pCVar1 = (this_00->constant_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  uVar7 = 0;
  ppSVar15 = local_58;
  bVar17 = true;
  do {
    bVar4 = bVar17;
    pOVar9 = Instruction::GetInOperand(inst,uVar7);
    if (pOVar9->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    ppuVar2 = (uint **)(pOVar9->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar10 = &(pOVar9->words).small_data_;
    if (ppuVar2 != (uint **)0x0) {
      ppuVar10 = ppuVar2;
    }
    local_44 = **ppuVar10;
    if ((id_map->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    local_44 = (*id_map->_M_invoker)((_Any_data *)id_map,&local_44);
    cVar11 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(pCVar1->id_to_const_val_)._M_h,&local_44);
    if ((cVar11.
         super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
         ._M_cur == (__node_type *)0x0) ||
       (*(long **)((long)cVar11.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                         ._M_cur + 0x10) == (long *)0x0)) {
      pSVar12 = (ScalarConstant *)0x0;
    }
    else {
      pSVar12 = (ScalarConstant *)
                (**(code **)(**(long **)((long)cVar11.
                                               super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                                               ._M_cur + 0x10) + 0x70))();
    }
    *ppSVar15 = pSVar12;
    uVar7 = 1;
    ppSVar15 = &local_60;
    bVar17 = false;
  } while (bVar4);
  bVar17 = false;
  switch((int)local_38) {
  case 0xac:
    if ((local_58[0] != (ScalarConstant *)0x0) &&
       (iVar6 = (*(local_58[0]->super_Constant)._vptr_Constant[0x17])(), (char)iVar6 != '\0'))
    goto LAB_0056b082;
    uVar7 = 0;
    if (local_60 == (ScalarConstant *)0x0) {
      return false;
    }
    uVar5 = analysis::ScalarConstant::GetU32BitValue(local_60);
    if (uVar5 != 0xffffffff) {
      return false;
    }
    break;
  case 0xad:
    if (local_58[0] != (ScalarConstant *)0x0) {
      analysis::IntConstant::GetS32BitValue((IntConstant *)local_58[0]);
    }
    uVar7 = 0;
    if (local_60 == (ScalarConstant *)0x0) {
      return false;
    }
    iVar8 = analysis::IntConstant::GetS32BitValue((IntConstant *)local_60);
    if (iVar8 != 0x7fffffff) {
      return false;
    }
    break;
  case 0xae:
    if ((local_58[0] == (ScalarConstant *)0x0) ||
       (uVar7 = analysis::ScalarConstant::GetU32BitValue(local_58[0]), uVar7 != 0xffffffff)) {
      if (local_60 == (ScalarConstant *)0x0) {
        return false;
      }
      uVar7 = analysis::ScalarConstant::GetU32BitValue(local_60);
      if (uVar7 != 0) {
        return false;
      }
    }
    goto LAB_0056af2c;
  case 0xaf:
    if (local_58[0] == (ScalarConstant *)0x0) {
LAB_0056b03b:
      if (local_60 != (ScalarConstant *)0x0) {
        analysis::IntConstant::GetS32BitValue((IntConstant *)local_60);
      }
      return false;
    }
    iVar8 = analysis::IntConstant::GetS32BitValue((IntConstant *)local_58[0]);
    uVar7 = 1;
    if (iVar8 != 0x7fffffff) goto LAB_0056b03b;
    break;
  case 0xb0:
    if ((local_58[0] != (ScalarConstant *)0x0) &&
       (uVar7 = analysis::ScalarConstant::GetU32BitValue(local_58[0]), uVar7 == 0xffffffff))
    goto LAB_0056b082;
    uVar7 = 0;
    if (local_60 == (ScalarConstant *)0x0) {
      return false;
    }
    uVar5 = analysis::ScalarConstant::GetU32BitValue(local_60);
    if (uVar5 != 0) {
      return false;
    }
    break;
  case 0xb1:
    if ((local_58[0] == (ScalarConstant *)0x0) ||
       (iVar8 = analysis::IntConstant::GetS32BitValue((IntConstant *)local_58[0]),
       iVar8 != 0x7fffffff)) {
      if (local_60 != (ScalarConstant *)0x0) {
        analysis::IntConstant::GetS32BitValue((IntConstant *)local_60);
        return false;
      }
      return false;
    }
    goto LAB_0056b082;
  case 0xb2:
    if (local_58[0] != (ScalarConstant *)0x0) {
      iVar6 = (*(local_58[0]->super_Constant)._vptr_Constant[0x17])();
      uVar7 = 1;
      if ((char)iVar6 != '\0') break;
    }
    if (local_60 == (ScalarConstant *)0x0) {
      return false;
    }
    uVar7 = analysis::ScalarConstant::GetU32BitValue(local_60);
    if (uVar7 != 0xffffffff) {
      return false;
    }
LAB_0056af2c:
    uVar7 = 1;
    break;
  case 0xb3:
    if (local_58[0] != (ScalarConstant *)0x0) {
      analysis::IntConstant::GetS32BitValue((IntConstant *)local_58[0]);
    }
    if (local_60 == (ScalarConstant *)0x0) {
      return false;
    }
    iVar8 = analysis::IntConstant::GetS32BitValue((IntConstant *)local_60);
    uVar7 = 1;
    if (iVar8 != 0x7fffffff) {
      return false;
    }
    break;
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 0xbb:
  case 0xbc:
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xc0:
  case 0xc1:
  case 0xc3:
  case 0xc6:
    goto switchD_0056ad9b_caseD_b4;
  case 0xc2:
  case 0xc4:
    uVar7 = 0;
    if (local_60 == (ScalarConstant *)0x0) {
      return false;
    }
    uVar5 = analysis::ScalarConstant::GetU32BitValue(local_60);
    if (uVar5 < 0x20) {
      return false;
    }
    break;
  case 0xc5:
    ppSVar13 = local_58;
    bVar17 = true;
    while ((*ppSVar13 == (ScalarConstant *)0x0 ||
           (uVar7 = analysis::ScalarConstant::GetU32BitValue(*ppSVar13), uVar7 != 0xffffffff))) {
      uVar3 = !bVar17;
      ppSVar13 = ppSVar15;
      bVar17 = false;
      if ((bool)uVar3) {
        return false;
      }
    }
    uVar7 = 0xffffffff;
    break;
  case 199:
    ppSVar13 = local_58;
    bVar17 = true;
    while ((*ppSVar13 == (ScalarConstant *)0x0 ||
           (iVar6 = (*((*ppSVar13)->super_Constant)._vptr_Constant[0x17])(), (char)iVar6 == '\0')))
    {
      uVar3 = !bVar17;
      ppSVar13 = ppSVar15;
      bVar17 = false;
      if ((bool)uVar3) {
        return false;
      }
    }
LAB_0056b082:
    uVar7 = 0;
    break;
  default:
    uVar14 = (int)local_38 - 0x84;
    if (uVar14 < 8) {
      if ((0xecU >> (uVar14 & 0x1f) & 1) == 0) {
        if (uVar14 == 0) {
          bVar17 = false;
          ppSVar13 = local_58;
          bVar4 = true;
          do {
            bVar16 = bVar4;
            if ((*ppSVar13 != (ScalarConstant *)0x0) &&
               (iVar6 = (*((*ppSVar13)->super_Constant)._vptr_Constant[0x17])(), (char)iVar6 != '\0'
               )) goto LAB_0056b082;
            ppSVar13 = ppSVar15;
            bVar4 = false;
          } while (bVar16);
        }
      }
      else {
        bVar17 = false;
        ppSVar13 = local_58;
        bVar4 = true;
        do {
          bVar16 = bVar4;
          if ((*ppSVar13 != (ScalarConstant *)0x0) &&
             (iVar6 = (*((*ppSVar13)->super_Constant)._vptr_Constant[0x17])(), (char)iVar6 != '\0'))
          goto LAB_0056b082;
          ppSVar13 = ppSVar15;
          bVar4 = false;
        } while (bVar16);
      }
    }
    goto switchD_0056ad9b_caseD_b4;
  }
  *local_40 = uVar7;
  bVar17 = true;
switchD_0056ad9b_caseD_b4:
  return bVar17;
}

Assistant:

bool InstructionFolder::FoldBinaryIntegerOpToConstant(
    Instruction* inst, const std::function<uint32_t(uint32_t)>& id_map,
    uint32_t* result) const {
  spv::Op opcode = inst->opcode();
  analysis::ConstantManager* const_manger = context_->get_constant_mgr();

  uint32_t ids[2];
  const analysis::IntConstant* constants[2];
  for (uint32_t i = 0; i < 2; i++) {
    const Operand* operand = &inst->GetInOperand(i);
    if (operand->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    ids[i] = id_map(operand->words[0]);
    const analysis::Constant* constant =
        const_manger->FindDeclaredConstant(ids[i]);
    constants[i] = (constant != nullptr ? constant->AsIntConstant() : nullptr);
  }

  switch (opcode) {
    // Arthimetics
    case spv::Op::OpIMul:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr && constants[i]->IsZero()) {
          *result = 0;
          return true;
        }
      }
      break;
    case spv::Op::OpUDiv:
    case spv::Op::OpSDiv:
    case spv::Op::OpSRem:
    case spv::Op::OpSMod:
    case spv::Op::OpUMod:
      // This changes undefined behaviour (ie divide by 0) into a 0.
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr && constants[i]->IsZero()) {
          *result = 0;
          return true;
        }
      }
      break;

    // Shifting
    case spv::Op::OpShiftRightLogical:
    case spv::Op::OpShiftLeftLogical:
      if (constants[1] != nullptr) {
        // When shifting by a value larger than the size of the result, the
        // result is undefined.  We are setting the undefined behaviour to a
        // result of 0.  If the shift amount is the same as the size of the
        // result, then the result is defined, and it 0.
        uint32_t shift_amount = constants[1]->GetU32BitValue();
        if (shift_amount >= 32) {
          *result = 0;
          return true;
        }
      }
      break;

    // Bitwise operations
    case spv::Op::OpBitwiseOr:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          // TODO: Change the mask against a value based on the bit width of the
          // instruction result type.  This way we can handle say 16-bit values
          // as well.
          uint32_t mask = constants[i]->GetU32BitValue();
          if (mask == 0xFFFFFFFF) {
            *result = 0xFFFFFFFF;
            return true;
          }
        }
      }
      break;
    case spv::Op::OpBitwiseAnd:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          if (constants[i]->IsZero()) {
            *result = 0;
            return true;
          }
        }
      }
      break;

    // Comparison
    case spv::Op::OpULessThan:
      if (constants[0] != nullptr &&
          constants[0]->GetU32BitValue() == UINT32_MAX) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr && constants[1]->GetU32BitValue() == 0) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpSLessThan:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MAX) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MIN) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpUGreaterThan:
      if (constants[0] != nullptr && constants[0]->IsZero()) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetU32BitValue() == UINT32_MAX) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpSGreaterThan:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MIN) {
        *result = false;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MAX) {
        *result = false;
        return true;
      }
      break;
    case spv::Op::OpULessThanEqual:
      if (constants[0] != nullptr && constants[0]->IsZero()) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetU32BitValue() == UINT32_MAX) {
        *result = true;
        return true;
      }
      break;
    case spv::Op::OpSLessThanEqual:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MIN) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MAX) {
        *result = true;
        return true;
      }
      break;
    case spv::Op::OpUGreaterThanEqual:
      if (constants[0] != nullptr &&
          constants[0]->GetU32BitValue() == UINT32_MAX) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr && constants[1]->GetU32BitValue() == 0) {
        *result = true;
        return true;
      }
      break;
    case spv::Op::OpSGreaterThanEqual:
      if (constants[0] != nullptr &&
          constants[0]->GetS32BitValue() == INT32_MAX) {
        *result = true;
        return true;
      }
      if (constants[1] != nullptr &&
          constants[1]->GetS32BitValue() == INT32_MIN) {
        *result = true;
        return true;
      }
      break;
    default:
      break;
  }
  return false;
}